

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O1

int __thiscall CNet::GetLength(CNet *this,int iMode,int iValue)

{
  pointer ppCVar1;
  CWire *this_00;
  int iVar2;
  CLayer *this_01;
  int iVar3;
  pointer ppCVar4;
  
  iVar2 = 0;
  iVar3 = 0;
  if (((this->super_CObject).m_iProp & 1) == 0) {
    iVar3 = iVar2;
    if (iMode == 0x100000) {
      ppCVar4 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar1 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar4 != ppCVar1) {
        iVar3 = 0;
        do {
          this_00 = *ppCVar4;
          this_01 = CWire::GetLayer(this_00);
          if ((this_01 != (CLayer *)0x0) && (iVar2 = CLayer::Z(this_01), iVar2 == iValue)) {
            iVar2 = CWire::GetLength(this_00);
            iVar3 = iVar3 + iVar2;
          }
          ppCVar4 = ppCVar4 + 1;
        } while (ppCVar4 != ppCVar1);
      }
    }
    else if (iMode == 1) {
      ppCVar4 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar1 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar4 != ppCVar1) {
        iVar3 = 0;
        do {
          if ((((*ppCVar4)->super_CObject).m_iState & iValue) != 0) {
            iVar2 = CWire::GetLength(*ppCVar4);
            iVar3 = iVar3 + iVar2;
          }
          ppCVar4 = ppCVar4 + 1;
        } while (ppCVar4 != ppCVar1);
      }
    }
    else {
      if (iMode != 0) {
        __assert_fail("FALSE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                      ,0xad,"int CNet::GetLength(int, int)");
      }
      ppCVar4 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppCVar1 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar4 != ppCVar1) {
        iVar3 = 0;
        do {
          if ((((*ppCVar4)->super_CObject).m_iProp & iValue) != 0) {
            iVar2 = CWire::GetLength(*ppCVar4);
            iVar3 = iVar3 + iVar2;
          }
          ppCVar4 = ppCVar4 + 1;
        } while (ppCVar4 != ppCVar1);
      }
    }
  }
  return iVar3;
}

Assistant:

int CNet::GetLength(int iMode, int iValue)
{
	if(IsLocal())	return	0;
	
	int	iLength	=	0;
	switch(iMode) {
	case GET_MODE_PROP:
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			if(pWire->GetProp()&iValue)	iLength	+=	pWire->GetLength();
		}
		break;
	case GET_MODE_STATE:
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			if(pWire->GetState()&iValue)	iLength	+=	pWire->GetLength();
		}
		break;
	case GET_MODE_LAYER:
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			CLayer*	pLayer	=	pWire->GetLayer();

			if(pLayer&&pLayer->Z()==iValue)	iLength	+=	pWire->GetLength();
		}
		break;
	default:
		assert(FALSE);
		break;
	}

	return	iLength;
}